

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void __thiscall deqp::egl::anon_unknown_1::InfiniteLoop::setup(InfiniteLoop *this)

{
  ShaderType SVar1;
  char *pcVar2;
  pointer *ppbVar3;
  GLenum GVar4;
  GLint GVar5;
  pointer __dest;
  long *plVar6;
  ostream *poVar7;
  TestError *pTVar8;
  pointer pbVar9;
  long *plVar10;
  Functions *gl;
  char *pcVar11;
  long lVar12;
  string loopHeader;
  size_type __dnew;
  string iterCount;
  ostringstream vert;
  ostringstream frag;
  ShaderProgram program;
  long *local_670;
  long local_660;
  long lStack_658;
  pointer local_650;
  value_type local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  undefined1 local_608 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  Functions *local_5e0;
  long *local_5d8;
  long local_5d0;
  long local_5c8 [2];
  long *local_5b8;
  long local_5b0;
  long local_5a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  long lStack_580;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_508;
  deUint32 local_4f0;
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [24];
  undefined8 uStack_4b0;
  ios_base local_458 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_438;
  deUint32 local_420;
  undefined1 local_418 [208];
  ProgramSources local_348;
  undefined1 local_278 [8];
  value_type local_270 [3];
  ios_base local_208 [264];
  ShaderProgram local_100;
  
  gl = (this->super_ContextReset).m_gl;
  SVar1 = (this->super_ContextReset).m_shaderType;
  if (SVar1 == SHADERTYPE_COMPUTE) {
    local_418[0x10] = 0;
    local_418._17_8_ = 0;
    local_418._0_8_ = (pointer)0x0;
    local_418[8] = 0;
    local_418._9_7_ = 0;
    memset(local_4c8,0,0xac);
    ppbVar3 = &local_598.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_650 = (pointer)0x102;
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar3;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_598,(ulong)&local_650);
    pbVar9 = local_650;
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_650;
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __dest;
    memcpy(__dest,
           "#version 310 es\nlayout(local_size_x = 1, local_size_y = 1) in;\nuniform highp int u_iterCount;\nwriteonly buffer Output { highp int b_output_int; };\nvoid main ()\n{\n\tfor (highp int i = 0; i < u_iterCount || u_iterCount < 0; ++i)\n\t\tb_output_int = u_iterCount;\n}\n"
           ,0x102);
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
    *(undefined1 *)((long)&(__dest->_M_dataplus)._M_p + (long)pbVar9) = 0;
    local_278._0_4_ = 5;
    local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_270,
               local_598.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (undefined1 *)
               ((long)&(pbVar9->_M_dataplus)._M_p +
               (long)local_598.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_4c8 + (ulong)(uint)local_278._0_4_ * 0x18),local_270);
    lVar12 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_348.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar12),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_4c8 + lVar12));
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x90);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
              (&local_348.attribLocationBindings,&local_438);
    local_348.transformFeedbackBufferMode = local_420;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_348.transformFeedbackVaryings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_418);
    local_348.separable = (bool)local_418[0x18];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if (local_598.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar3) {
      operator_delete(local_598.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_598.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_418);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_438);
    lVar12 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_4c8 + lVar12));
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != -0x18);
    goto LAB_00e5219e;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4c8,"in highp vec2 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4c8,"uniform highp int u_iterCount;\n",0x1f);
  if (SVar1 == SHADERTYPE_VERT) {
LAB_00e51a0b:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c8,"out mediump vec4 v_color;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"in mediump vec4 v_color;\n",0x19);
  }
  else if ((SVar1 == SHADERTYPE_VERT_AND_FRAG) || (SVar1 == SHADERTYPE_FRAG)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c8,"flat out highp int v_iterCount;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"flat in highp int v_iterCount;\n",0x1f);
    if ((SVar1 == SHADERTYPE_VERT_AND_FRAG) || (SVar1 == SHADERTYPE_VERT)) goto LAB_00e51a0b;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"out mediump vec4 o_color;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4c8,"\nvoid main (void)\n{\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4c8,"\tgl_Position = vec4(a_position, 0.0, 1.0);\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4c8,"\tgl_PointSize = 1.0;\n",0x15);
  if ((SVar1 | SHADERTYPE_COMPUTE) == SHADERTYPE_VERT_AND_FRAG) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c8,"\tv_iterCount = u_iterCount;\n",0x1c);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\nvoid main (void)\n{\n",0x14);
  pcVar11 = "v_iterCount";
  if (SVar1 == SHADERTYPE_VERT) {
    pcVar11 = "u_iterCount";
  }
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  pcVar2 = "v_iterCount";
  if (SVar1 == SHADERTYPE_VERT) {
    pcVar2 = "u_iterCount";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,pcVar11,pcVar2 + 0xb);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                 "\tfor (highp int i = 0; i < ",&local_628);
  plVar6 = (long *)std::__cxx11::string::append(local_608);
  pbVar9 = (pointer)(plVar6 + 2);
  if ((pointer)*plVar6 == pbVar9) {
    local_648._M_string_length = (size_type)(pbVar9->_M_dataplus)._M_p;
    local_648.field_2._M_allocated_capacity = plVar6[3];
    local_650 = (pointer)&local_648._M_string_length;
  }
  else {
    local_648._M_string_length = (size_type)(pbVar9->_M_dataplus)._M_p;
    local_650 = (pointer)*plVar6;
  }
  local_648._M_dataplus._M_p = (pointer)plVar6[1];
  *plVar6 = (long)pbVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_5e0 = gl;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_650,(ulong)local_628._M_dataplus._M_p);
  ppbVar3 = &local_598.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar9 = (pointer)(plVar6 + 2);
  if ((pointer)*plVar6 == pbVar9) {
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar9->_M_dataplus)._M_p;
    lStack_580 = plVar6[3];
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar3;
  }
  else {
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar9->_M_dataplus)._M_p;
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
  }
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar6[1];
  *plVar6 = (long)pbVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_598);
  local_670 = &local_660;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_660 = *plVar10;
    lStack_658 = plVar6[3];
  }
  else {
    local_660 = *plVar10;
    local_670 = (long *)*plVar6;
  }
  lVar12 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_598.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar3) {
    operator_delete(local_598.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_598.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_650 != (pointer)&local_648._M_string_length) {
    operator_delete(local_650,(ulong)(local_648._M_string_length + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_608._4_4_,local_608._0_4_) != &local_5f8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_608._4_4_,local_608._0_4_),local_5f8._M_allocated_capacity + 1
                   );
  }
  if (SVar1 == SHADERTYPE_VERT_AND_FRAG) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c8,"\tmediump vec4 color = ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"a_position.xyxy",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,";\n",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_4c8,(char *)local_670,lVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"color = cos(sin(color*1.25)*0.8);",0x21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"\tmediump vec4 color = ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"gl_FragCoord",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,";\n",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,(char *)local_670,lVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"color = cos(sin(color*1.25)*0.8);",0x21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  }
  else {
    poVar7 = (ostream *)local_278;
    if (SVar1 == SHADERTYPE_VERT) {
      poVar7 = (ostream *)local_4c8;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tmediump vec4 color = ",0x16);
    pcVar11 = "gl_FragCoord";
    if (SVar1 == SHADERTYPE_VERT) {
      pcVar11 = "a_position.xyxy";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,pcVar11,(ulong)(SVar1 == SHADERTYPE_VERT) * 3 + 0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_670,lVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"color = cos(sin(color*1.25)*0.8);",0x21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  }
  if ((SVar1 == SHADERTYPE_VERT_AND_FRAG) || (SVar1 == SHADERTYPE_VERT)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c8,"\tv_color = color;\n",0x12);
    lVar12 = 0x14;
    pcVar11 = "\to_color = v_color;\n";
  }
  else {
    lVar12 = 0x12;
    pcVar11 = "\to_color = color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar11,lVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}\n",2);
  local_4e8[0x10] = 0;
  local_4e8._17_8_ = 0;
  local_4e8._0_8_ = (pointer)0x0;
  local_4e8[8] = 0;
  local_4e8._9_7_ = 0;
  memset(&local_598,0,0xac);
  std::__cxx11::stringbuf::str();
  local_650 = (pointer)((ulong)local_650 & 0xffffffff00000000);
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_648,local_5b8,local_5b0 + (long)local_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_598 + ((ulong)local_650 & 0xffffffff),&local_648);
  std::__cxx11::stringbuf::str();
  local_608._0_4_ = 1;
  local_608._8_8_ = local_5f8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_608 + 8),local_5d8,local_5d0 + (long)local_5d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_598 + (uint)local_608._0_4_,(value_type *)(local_608 + 8));
  lVar12 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_348.sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar12),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_598.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar12));
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&local_348.attribLocationBindings,&local_508);
  local_348.transformFeedbackBufferMode = local_4f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_348.transformFeedbackVaryings,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_4e8);
  local_348.separable = (bool)local_4e8[0x18];
  if ((char *)local_608._8_8_ != local_5f8._M_local_buf + 8) {
    operator_delete((void *)local_608._8_8_,local_5f8._8_8_ + 1);
  }
  if (local_5d8 != local_5c8) {
    operator_delete(local_5d8,local_5c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  gl = local_5e0;
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8,local_5a8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_508);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_598.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  if (local_670 != &local_660) {
    operator_delete(local_670,local_660 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
  std::ios_base::~ios_base(local_458);
LAB_00e5219e:
  glu::ShaderProgram::ShaderProgram(&local_100,gl,&local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_348.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_348.attribLocationBindings);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_348.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  glu::operator<<((this->super_ContextReset).m_log,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x33b);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_ContextReset).m_gl)->useProgram)(local_100.m_program.m_program);
  GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar4,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x33d);
  if ((this->super_ContextReset).m_shaderType == SHADERTYPE_COMPUTE) {
    this->m_outputBuffer = 0;
    (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_outputBuffer);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,"genBuffers(1, &m_outputBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x343);
    (*((this->super_ContextReset).m_gl)->bindBuffer)(0x90d2,this->m_outputBuffer);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,"bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x344);
    (*((this->super_ContextReset).m_gl)->bufferData)(0x90d2,4,(void *)0x0,0x88e8);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,
                    "bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(int), DE_NULL, GL_DYNAMIC_DRAW)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x345);
    (*((this->super_ContextReset).m_gl)->bindBufferBase)(0x90d2,0,this->m_outputBuffer);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,"bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_outputBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x346);
  }
  else {
    local_4c8._16_8_ = &DAT_3f8000003f800000;
    uStack_4b0 = 0x3f800000bf800000;
    local_4c8._0_8_ = (_func_int **)0xbf800000bf800000;
    local_4c8._8_8_ = 0xbf8000003f800000;
    GVar5 = (*((this->super_ContextReset).m_gl)->getAttribLocation)
                      (local_100.m_program.m_program,"a_position");
    this->m_coordLocation = GVar5;
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x353);
    if (this->m_coordLocation == -1) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,(char *)0x0,"m_coordLocation != (glw::GLint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                 ,0x354);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this->m_coordinatesBuffer = 0;
    (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_coordinatesBuffer);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,"genBuffers(1, &m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x358);
    (*((this->super_ContextReset).m_gl)->bindBuffer)(0x8892,this->m_coordinatesBuffer);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,"bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x359);
    (*((this->super_ContextReset).m_gl)->bufferData)(0x8892,0x20,local_4c8,0x88e4);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,
                    "bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x35a);
    (*((this->super_ContextReset).m_gl)->enableVertexAttribArray)(this->m_coordLocation);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,"enableVertexAttribArray(m_coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x35b);
    (*((this->super_ContextReset).m_gl)->vertexAttribPointer)
              (this->m_coordLocation,2,0x1406,'\0',0,(void *)0x0);
    GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar4,"vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x35c);
  }
  GVar5 = (*((this->super_ContextReset).m_gl)->getUniformLocation)
                    (local_100.m_program.m_program,"u_iterCount");
  GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar4,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x360);
  if (GVar5 == -1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,(char *)0x0,"iterCountLocation != (glw::GLint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x361);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_ContextReset).m_gl)->uniform1i)(GVar5,-1);
  GVar4 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar4,"uniform1i(iterCountLocation, iterCount)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x365);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return;
}

Assistant:

void InfiniteLoop::setup (void)
{
	glu::ShaderProgram program (m_gl, genSources());
	m_log << program;

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	if (m_shaderType == SHADERTYPE_COMPUTE)
	{
		// Output buffer setup
		m_outputBuffer = 0;
		GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_outputBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(int), DE_NULL, GL_DYNAMIC_DRAW));
		GLU_CHECK_GLW_CALL(m_gl, bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_outputBuffer));
	}
	else
	{
		const glw::GLfloat coords[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
			-1.0f, +1.0f
		};

		m_coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_position");
		GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
		TCU_CHECK(m_coordLocation != (glw::GLint)-1);

		// Load the vertex data
		m_coordinatesBuffer = 0;
		GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW));
		GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(m_coordLocation));
		GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL));
	}

	glw::GLint iterCountLocation = m_gl.getUniformLocation(program.getProgram(), "u_iterCount");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(iterCountLocation != (glw::GLint)-1);

	// Set the iteration count (infinite)
	glw::GLint iterCount = -1;
	GLU_CHECK_GLW_CALL(m_gl, uniform1i(iterCountLocation, iterCount));
}